

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

void __thiscall QMessageLogger::warning(QMessageLogger *this,QLoggingCategory *cat,char *msg,...)

{
  bool bVar1;
  QMessageLogContext *in_RCX;
  QLoggingCategory *in_RSI;
  __va_list_tag *in_RDI;
  QInternalMessageLogContext *in_R8;
  long in_FS_OFFSET;
  va_list ap;
  QInternalMessageLogContext ctxt;
  char *in_stack_fffffffffffffdb8;
  QMessageLogContext *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  QtMsgType in_stack_fffffffffffffdcc;
  undefined1 local_148 [320];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QLoggingCategory::isWarningEnabled((QLoggingCategory *)0x2423e8);
  if (bVar1) {
    memset(local_148,0xaa,0x140);
    QLoggingCategory::operator()(in_RSI);
    QInternalMessageLogContext::QInternalMessageLogContext
              (in_R8,in_RCX,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    qt_message(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_RDI)
    ;
    QInternalMessageLogContext::~QInternalMessageLogContext((QInternalMessageLogContext *)0x2424b6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageLogger::warning(const QLoggingCategory &cat, const char *msg, ...) const
{
    if (!cat.isWarningEnabled())
        return;

    QInternalMessageLogContext ctxt(context, cat());

    va_list ap;
    va_start(ap, msg); // use variable arg list
    qt_message(QtWarningMsg, ctxt, msg, ap);
    va_end(ap);
}